

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall
TileWire::_addNextTile
          (TileWire *this,Tile *nextTile,Direction direction,State *state,FollowWireStage *stage)

{
  uint uVar1;
  bool bVar2;
  Direction DVar3;
  State SVar4;
  Board *pBVar5;
  TileGate *nextGate;
  Direction local_40;
  TileWire *nextWire;
  
  if (nextTile == (Tile *)0x0) {
    __cxa_bad_typeid();
  }
  bVar2 = std::type_info::operator==((type_info *)nextTile->_vptr_Tile[-1],(type_info *)&typeinfo);
  uVar1 = Tile::currentUpdateTime;
  nextGate = (TileGate *)nextTile;
  if (bVar2) {
    if ((&(&this->super_Tile)[(long)(int)nextTile->_direction * 2].field_0x21)
        [(long)((int)(direction + SOUTH) % 4) +
         (long)(int)direction * 4 + (long)*(int *)&nextTile[8].field_0x24 * 0x10] == '\x01') {
      if ((direction & 0x80000001) == EAST && *(int *)&nextTile[8].field_0x24 == 4) {
        if (*(uint *)&nextTile[9].field_0xc == Tile::currentUpdateTime) {
          return;
        }
        *(State *)((long)&nextTile[9]._vptr_Tile + 4) = *state;
        *(uint *)&nextTile[9].field_0xc = uVar1;
      }
      else {
        if (nextTile[9]._direction == Tile::currentUpdateTime) {
          return;
        }
        *(State *)&nextTile[9]._vptr_Tile = *state;
        nextTile[9]._direction = uVar1;
      }
      nextWire = (TileWire *)nextTile;
      (*nextTile->_vptr_Tile[8])(nextTile,1,0);
      local_40 = direction;
      std::vector<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>::
      emplace_back<std::pair<TileWire*,Direction>>
                ((vector<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>
                  *)&traversedWires,(pair<TileWire_*,_Direction> *)&nextGate);
      nextGate = (TileGate *)nextTile;
      local_40 = direction;
      std::deque<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>::
      emplace_back<std::pair<TileWire*,Direction>>
                ((deque<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>
                  *)&wireNodes,(pair<TileWire_*,_Direction> *)&nextGate);
      pBVar5 = Tile::getBoardPtr(&this->super_Tile);
      if (((pBVar5->wireUpdates)._M_h._M_element_count != 0) &&
         ((*(int *)&nextTile[8].field_0x24 != 4 ||
          (nextTile[9]._direction == *(Direction *)&nextTile[9].field_0xc)))) {
        pBVar5 = Tile::getBoardPtr(&this->super_Tile);
        std::
        _Hashtable<TileWire_*,_TileWire_*,_std::allocator<TileWire_*>,_std::__detail::_Identity,_std::equal_to<TileWire_*>,_std::hash<TileWire_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&(pBVar5->wireUpdates)._M_h,&nextWire);
      }
    }
  }
  else {
    bVar2 = std::type_info::operator==
                      ((type_info *)nextTile->_vptr_Tile[-1],(type_info *)&TileGate::typeinfo);
    if (bVar2) {
      DVar3 = Tile::getDirection(nextTile);
      if (((int)(DVar3 + SOUTH) % 4 == direction) &&
         (SVar4 = TileGate::getNextState((TileGate *)nextTile), SVar4 != DISCONNECTED)) {
        if (Board::enableExtraLogicStates == true) {
          _checkForInvalidState((TileWire *)nextTile,SVar4,state,stage);
          return;
        }
        if (SVar4 != HIGH) {
          return;
        }
        if (*state != LOW) {
          return;
        }
        *state = HIGH;
        _fixTraversedWires((TileWire *)nextTile,HIGH);
        return;
      }
      std::vector<TileGate_*,_std::allocator<TileGate_*>_>::push_back
                (&Board::endpointGates,&nextGate);
    }
    else {
      bVar2 = std::type_info::operator==
                        ((type_info *)nextTile->_vptr_Tile[-1],(type_info *)&TileLED::typeinfo);
      if (bVar2) {
        std::vector<TileLED*,std::allocator<TileLED*>>::emplace_back<TileLED*>
                  ((vector<TileLED*,std::allocator<TileLED*>> *)&Board::endpointLEDs,
                   (TileLED **)&nextGate);
      }
      else {
        bVar2 = std::type_info::operator==
                          ((type_info *)nextTile->_vptr_Tile[-1],(type_info *)&TileSwitch::typeinfo)
        ;
        if ((!bVar2) &&
           (bVar2 = std::type_info::operator==
                              ((type_info *)nextTile->_vptr_Tile[-1],
                               (type_info *)&TileButton::typeinfo), !bVar2)) {
          return;
        }
        bVar2 = Board::enableExtraLogicStates;
        SVar4 = (*nextTile->_vptr_Tile[2])();
        if (bVar2 == true) {
          _checkForInvalidState((TileWire *)nextTile,SVar4,state,stage);
          return;
        }
        if ((SVar4 == HIGH) && (*state == LOW)) {
          *state = HIGH;
          _fixTraversedWires((TileWire *)nextTile,HIGH);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TileWire::_addNextTile(Tile* nextTile, Direction direction, State& state, FollowWireStage& stage) const {
    if (typeid(*nextTile) == typeid(TileWire)) {    // Check if nextTile is a wire (most common case).
        TileWire* nextWire = static_cast<TileWire*>(nextTile);
        if (CONNECTION_INFO[nextWire->_direction][nextWire->_type][direction][(direction + 2) % 4]) {    // Check if we have a connection back to the source.
            bool wireUpdated = false;
            if (nextWire->_type == CROSSOVER && direction % 2 == 1) {    // Update state of the wire and timestamp if this wire has not been traversed yet.
                if (nextWire->_updateTimestamp2 != Tile::currentUpdateTime) {
                    nextWire->_state2 = state;
                    nextWire->_updateTimestamp2 = Tile::currentUpdateTime;
                    wireUpdated = true;
                }
            } else if (nextWire->_updateTimestamp1 != Tile::currentUpdateTime) {
                nextWire->_state1 = state;
                nextWire->_updateTimestamp1 = Tile::currentUpdateTime;
                wireUpdated = true;
            }
            
            if (wireUpdated) {    // If wire updated in last step, give it a cosmetic update and add it to traversal structures.
                nextWire->addUpdate(true);
                traversedWires.push_back(pair<TileWire*, Direction>(nextWire, direction));
                wireNodes.push(pair<TileWire*, Direction>(nextWire, direction));
                if (!getBoardPtr()->wireUpdates.empty() && (nextWire->_type != CROSSOVER || nextWire->_updateTimestamp1 == nextWire->_updateTimestamp2)) {    // Attempt to remove update if scheduled and wire has been fully updated.
                    getBoardPtr()->wireUpdates.erase(nextWire);
                }
            }
        }
    } else if (typeid(*nextTile) == typeid(TileGate)) {    // Else check if it is a gate.
        TileGate* nextGate = static_cast<TileGate*>(nextTile);
        State gateNextState = (nextGate->getDirection() + 2) % 4 == direction ? nextGate->getNextState() : DISCONNECTED;    // If the gate outputs into previous wire, there may be a state conflict.
        if (gateNextState != DISCONNECTED) {
            if (Board::enableExtraLogicStates) {
                _checkForInvalidState(gateNextState, state, stage);
            } else if (gateNextState == HIGH && state == LOW) {    // If currently LOW and gate outputs HIGH in the next state, conflict found.
                state = HIGH;
                _fixTraversedWires(state);
            }
        } else {    // This gate is an endpoint, no need to check for conflict.
            Board::endpointGates.push_back(nextGate);
        }
    } else if (typeid(*nextTile) == typeid(TileLED)) {    // Else check if it is an LED.
        Board::endpointLEDs.push_back(static_cast<TileLED*>(nextTile));
    } else if (typeid(*nextTile) == typeid(TileSwitch) || typeid(*nextTile) == typeid(TileButton)) {    // Else check if switch/button.
        if (Board::enableExtraLogicStates) {
            _checkForInvalidState(nextTile->getState(), state, stage);
        } else if (nextTile->getState() == HIGH && state == LOW) {    // If currently LOW and switch/button outputs HIGH, conflict found.
            state = HIGH;
            _fixTraversedWires(state);
        }
    }
}